

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImgDisplay * __thiscall
cimg_library::CImgDisplay::assign<float>
          (CImgDisplay *this,CImg<float> *img,char *title,uint normalization_type,
          bool fullscreen_flag,bool closed_flag)

{
  float *pfVar1;
  CImgDisplay *pCVar2;
  CImg<float> tmp;
  CImg<float> local_50;
  
  if (img->_data != (float *)0x0) {
    tmp._data = (float *)0x0;
    tmp._width = 0;
    tmp._height = 0;
    tmp._depth = 0;
    tmp._spectrum = 0;
    tmp._is_shared = false;
    if (img->_depth != 1) {
      CImg<float>::get_projections2d
                (&local_50,img,img->_width - 1 >> 1,img->_height - 1 >> 1,img->_depth - 1 >> 1);
      img = CImg<float>::assign<float>(&tmp,&local_50);
      CImg<float>::~CImg(&local_50);
    }
    _assign(this,img->_width,img->_height,title,normalization_type,fullscreen_flag,closed_flag);
    if (this->_normalization == 2) {
      pfVar1 = CImg<float>::min_max<float>(img,&this->_max);
      this->_min = *pfVar1;
    }
    pCVar2 = render<float>(this,img,false);
    pCVar2 = paint(pCVar2,true);
    CImg<float>::~CImg(&tmp);
    return pCVar2;
  }
  pCVar2 = assign(this);
  return pCVar2;
}

Assistant:

CImgDisplay& assign(const CImg<T>& img, const char *const title=0,
                        const unsigned int normalization_type=3,
                        const bool fullscreen_flag=false, const bool closed_flag=false) {
      if (!img) return assign();
      CImg<T> tmp;
      const CImg<T>& nimg = (img._depth==1)?img:(tmp=img.get_projections2d((img._width-1)/2,(img._height-1)/2,(img._depth-1)/2));
      _assign(nimg._width,nimg._height,title,normalization_type,fullscreen_flag,closed_flag);
      if (_normalization==2) _min = (float)nimg.min_max(_max);
      return render(nimg).paint();
    }